

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_biquad_init(ma_biquad_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                        ma_biquad *pBQ)

{
  ma_result mVar1;
  void *pHeap;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pConfig != (ma_biquad_config *)0x0) && ((ulong)pConfig->channels != 0)) {
    pHeap = ma_malloc((ulong)pConfig->channels << 3,pAllocationCallbacks);
    if (pHeap == (void *)0x0) {
      mVar1 = MA_OUT_OF_MEMORY;
    }
    else {
      mVar1 = ma_biquad_init_preallocated(pConfig,pHeap,pBQ);
      if (mVar1 == MA_SUCCESS) {
        pBQ->_ownsHeap = 1;
        mVar1 = MA_SUCCESS;
      }
      else {
        ma_free(pHeap,pAllocationCallbacks);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_biquad_init(const ma_biquad_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_biquad* pBQ)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_biquad_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_biquad_init_preallocated(pConfig, pHeap, pBQ);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBQ->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}